

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

Frag __thiscall duckdb_re2::Compiler::Capture(Compiler *this,Frag a,int n)

{
  uint uVar1;
  uint uVar2;
  Compiler *this_00;
  Frag FVar4;
  uint uStack_48;
  uint uStack_44;
  Frag a_local;
  undefined8 uVar3;
  
  this_00 = this;
  if (a.begin != 0) {
    uVar2 = AllocInst(this,2);
    if (-1 < (int)uVar2) {
      Prog::Inst::InitCapture
                ((this->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl + uVar2,n * 2,
                 a.begin);
      Prog::Inst::InitCapture
                ((this->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl +
                 (ulong)uVar2 + 1,n * 2 + 1,0);
      PatchList::Patch((this->inst_).ptr_._M_t.
                       super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                       .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl,a.end,
                       uVar2 + 1);
      uVar1 = uVar2 * 2 + 2;
      uStack_48 = uVar1 / 1;
      uStack_44 = CONCAT31(uStack_44._1_3_,a.nullable) & 0xffffff01;
      uVar3 = CONCAT44(uVar1,uVar2);
      goto LAB_01ec5362;
    }
  }
  FVar4 = NoMatch(this_00);
  uVar3 = FVar4._0_8_;
  uStack_48 = FVar4.end.tail;
  uStack_44 = CONCAT31(uStack_44._1_3_,FVar4.nullable);
LAB_01ec5362:
  FVar4._12_4_ = uStack_44;
  FVar4.end.tail = uStack_48;
  FVar4.begin = (int)uVar3;
  FVar4.end.head = (int)((ulong)uVar3 >> 0x20);
  return FVar4;
}

Assistant:

Frag Compiler::Capture(Frag a, int n) {
  if (IsNoMatch(a))
    return NoMatch();
  int id = AllocInst(2);
  if (id < 0)
    return NoMatch();
  inst_[id].InitCapture(2*n, a.begin);
  inst_[id+1].InitCapture(2*n+1, 0);
  PatchList::Patch(inst_.data(), a.end, id+1);

  return Frag(id, PatchList::Mk((id+1) << 1), a.nullable);
}